

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ostream * __thiscall
parser::GrammaticSymbol::stringify
          (GrammaticSymbol *this,ostream *out,TerminalNames *terminalNames,
          NonTerminalNames *nonTerminalNames)

{
  ostream *poVar1;
  char *pcVar2;
  string local_40;
  
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xe;
  pcVar2 = "NonTerminal";
  if (this->isTerminal != false) {
    pcVar2 = "Terminal";
  }
  poVar1 = std::operator<<(out,pcVar2);
  poVar1 = std::operator<<(poVar1,": ");
  if (this->isTerminal == true) {
    lexer::terminalName(&local_40,this->value,terminalNames);
  }
  else {
    nonTerminalName(&local_40,this->value,nonTerminalNames);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return poVar1;
}

Assistant:

std::ostream& stringify(std::ostream& out, lexer::TerminalNames const& terminalNames, NonTerminalNames const& nonTerminalNames) const {
            return out << std::setw(14)
                         << (isTerminal ? "Terminal" : "NonTerminal") << ": "
                         << (isTerminal ? lexer::terminalName(value, terminalNames) : nonTerminalName(value, nonTerminalNames));
        }